

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O3

JSONNode * __thiscall JSONNode::at(JSONNode *this,json_index_t pos)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  internalJSONNode *piVar2;
  jsonChildren *pjVar3;
  JSONNode *pJVar4;
  out_of_range *this_00;
  string *psVar5;
  size_type __dnew;
  size_type local_50;
  json_string local_48;
  
  piVar2 = this->internal;
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"no internal","");
  JSONDebug::_JSON_ASSERT(piVar2 != (internalJSONNode *)0x0,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  piVar2 = this->internal;
  if (0xfd < (byte)(piVar2->_type - 6)) {
    internalJSONNode::Fetch(piVar2);
    pjVar3 = piVar2->Children;
    local_50 = 0x15;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    local_48._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_48,(ulong)&local_50);
    local_48.field_2._M_allocated_capacity = local_50;
    builtin_strncpy(local_48._M_dataplus._M_p,"Children is null size",0x15);
    local_48._M_string_length = local_50;
    local_48._M_dataplus._M_p[local_50] = '\0';
    JSONDebug::_JSON_ASSERT(true,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if (pos < pjVar3->mysize) {
      pJVar4 = operator[](this,pos);
      return pJVar4;
    }
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"at() const out of bounds","")
  ;
  JSONDebug::_JSON_FAIL(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  psVar5 = jsonSingletonEMPTY_STD_STRING::getValue_abi_cxx11_();
  std::out_of_range::out_of_range(this_00,(string *)psVar5);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

json_throws(std::out_of_range) {
    JSON_CHECK_INTERNAL();
    if (json_unlikely(pos >= internal -> size())){
	   JSON_FAIL(JSON_TEXT("at() const out of bounds"));
	   json_throw(std::out_of_range(json_global(EMPTY_STD_STRING)));
    }
    return (*this)[pos];
}